

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

void __thiscall Imath_3_2::Matrix33<float>::Matrix33(Matrix33<float> *this,float (*a) [3])

{
  float (*a_local) [3];
  Matrix33<float> *this_local;
  
  this->x[0][0] = (*a)[0];
  this->x[0][1] = (*a)[1];
  this->x[0][2] = (*a)[2];
  this->x[1][0] = a[1][0];
  this->x[1][1] = a[1][1];
  this->x[1][2] = a[1][2];
  this->x[2][0] = a[2][0];
  this->x[2][1] = a[2][1];
  this->x[2][2] = a[2][2];
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix33<T>::Matrix33 (
    const T a[3][3]) IMATH_NOEXCEPT
{
    // Function calls and aliasing issues can inhibit vectorization versus
    // straight assignment of data members, so instead of this:
    //     memcpy (x, a, sizeof (x));
    // we do this:
    x[0][0] = a[0][0];
    x[0][1] = a[0][1];
    x[0][2] = a[0][2];
    x[1][0] = a[1][0];
    x[1][1] = a[1][1];
    x[1][2] = a[1][2];
    x[2][0] = a[2][0];
    x[2][1] = a[2][1];
    x[2][2] = a[2][2];
}